

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int32_t n_runs;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  _Bool _Var11;
  
  lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
  uVar3 = container1->cardinality;
  if ((*(uint *)(lVar5 + 4) & 0x20) == 0) {
    iVar7 = container2->n_runs;
    lVar5 = (long)iVar7;
    if (0 < lVar5) {
      lVar10 = 0;
      do {
        iVar7 = iVar7 + (uint)container2->runs[lVar10].length;
        lVar10 = lVar10 + 1;
      } while (lVar5 != lVar10);
    }
  }
  else {
    iVar7 = _avx2_run_container_cardinality(container2);
  }
  _Var11 = false;
  uVar4 = 0;
  if ((int)uVar3 <= iVar7) {
    if (0 < (int)uVar3) {
      uVar6 = 0;
      uVar8 = 0;
      do {
        uVar4 = (uint)uVar6;
        if (container2->n_runs <= (int)uVar8) break;
        uVar1 = container2->runs[uVar8].value;
        uVar2 = container1->array[uVar6];
        if (uVar2 < uVar1) {
          return false;
        }
        uVar9 = (uint)container2->runs[uVar8].length + (uint)uVar1;
        uVar8 = uVar8 + (uVar9 < uVar2);
        uVar4 = (uVar4 + 1) - (uint)(uVar9 < uVar2);
        uVar6 = (ulong)uVar4;
      } while ((int)uVar4 < (int)uVar3);
    }
    _Var11 = uVar4 == uVar3;
  }
  return _Var11;
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}